

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsInitialize(IDAMem IDA_mem)

{
  IDALsMem idals_mem_00;
  bool bVar1;
  int iVar2;
  IDAMem in_RDI;
  int retval;
  IDALsMem idals_mem;
  int local_4;
  
  if (in_RDI->ida_lmem == (void *)0x0) {
    IDAProcessError(in_RDI,-2,0x4f4,"idaLsInitialize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                    ,"Linear solver memory is NULL.");
    local_4 = -2;
  }
  else {
    idals_mem_00 = (IDALsMem)in_RDI->ida_lmem;
    if (idals_mem_00->J == (SUNMatrix)0x0) {
      idals_mem_00->jacDQ = 0;
      idals_mem_00->jac = (IDALsJacFn)0x0;
      idals_mem_00->J_data = (void *)0x0;
    }
    else if (idals_mem_00->jacDQ == 0) {
      idals_mem_00->J_data = in_RDI->ida_user_data;
    }
    else {
      bVar1 = false;
      if (idals_mem_00->J->ops->getid == (_func_SUNMatrix_ID_SUNMatrix *)0x0) {
        bVar1 = true;
      }
      else {
        iVar2 = SUNMatGetID(idals_mem_00->J);
        if ((iVar2 == 0) || (iVar2 = SUNMatGetID(idals_mem_00->J), iVar2 == 3)) {
          idals_mem_00->jac = idaLsDQJac;
          idals_mem_00->J_data = in_RDI;
        }
        else {
          bVar1 = true;
        }
      }
      if (bVar1) {
        IDAProcessError(in_RDI,-3,0x515,"idaLsInitialize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                        ,"No Jacobian constructor available for SUNMatrix type");
        idals_mem_00->last_flag = -3;
        return -3;
      }
    }
    idaLsInitializeCounters(idals_mem_00);
    if (idals_mem_00->jtimesDQ == 0) {
      idals_mem_00->jt_data = in_RDI->ida_user_data;
    }
    else {
      idals_mem_00->jtsetup = (IDALsJacTimesSetupFn)0x0;
      idals_mem_00->jtimes = idaLsDQJtimes;
      idals_mem_00->jt_data = in_RDI;
    }
    if ((idals_mem_00->J == (SUNMatrix)0x0) && (idals_mem_00->pset == (IDALsPrecSetupFn)0x0)) {
      in_RDI->ida_lsetup =
           (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0;
    }
    iVar2 = SUNLinSolGetType(idals_mem_00->LS);
    if (iVar2 == 3) {
      in_RDI->ida_lsetup =
           (_func_int_IDAMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector_N_Vector *)0x0;
      idals_mem_00->scalesol = 0;
    }
    iVar2 = SUNLinSolInitialize(idals_mem_00->LS);
    idals_mem_00->last_flag = iVar2;
    local_4 = idals_mem_00->last_flag;
  }
  return local_4;
}

Assistant:

int idaLsInitialize(IDAMem IDA_mem)
{
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Test for valid combinations of matrix & Jacobian routines: */
  if (idals_mem->J == NULL)
  {
    /* If SUNMatrix A is NULL: ensure 'jac' function pointer is NULL */
    idals_mem->jacDQ  = SUNFALSE;
    idals_mem->jac    = NULL;
    idals_mem->J_data = NULL;
  }
  else if (idals_mem->jacDQ)
  {
    /* If J is non-NULL, and 'jac' is not user-supplied:
       - if J is dense or band, ensure that our DQ approx. is used
       - otherwise => error */
    retval = 0;
    if (idals_mem->J->ops->getid)
    {
      if ((SUNMatGetID(idals_mem->J) == SUNMATRIX_DENSE) ||
          (SUNMatGetID(idals_mem->J) == SUNMATRIX_BAND))
      {
        idals_mem->jac    = idaLsDQJac;
        idals_mem->J_data = IDA_mem;
      }
      else { retval++; }
    }
    else { retval++; }
    if (retval)
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No Jacobian constructor available for SUNMatrix type");
      idals_mem->last_flag = IDALS_ILL_INPUT;
      return (IDALS_ILL_INPUT);
    }
  }
  else
  {
    /* If J is non-NULL, and 'jac' is user-supplied,
       reset J_data pointer (just in case) */
    idals_mem->J_data = IDA_mem->ida_user_data;
  }

  /* reset counters */
  idaLsInitializeCounters(idals_mem);

  /* Set Jacobian-related fields, based on jtimesDQ */
  if (idals_mem->jtimesDQ)
  {
    idals_mem->jtsetup = NULL;
    idals_mem->jtimes  = idaLsDQJtimes;
    idals_mem->jt_data = IDA_mem;
  }
  else { idals_mem->jt_data = IDA_mem->ida_user_data; }

  /* if J is NULL and psetup is not present, then idaLsSetup does
     not need to be called, so set the lsetup function to NULL */
  if ((idals_mem->J == NULL) && (idals_mem->pset == NULL))
  {
    IDA_mem->ida_lsetup = NULL;
  }

  /* When using a matrix-embedded linear solver disable lsetup call */
  if (SUNLinSolGetType(idals_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    IDA_mem->ida_lsetup = NULL;
    idals_mem->scalesol = SUNFALSE;
  }

  /* Call LS initialize routine */
  idals_mem->last_flag = SUNLinSolInitialize(idals_mem->LS);
  return (idals_mem->last_flag);
}